

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_collect_dirs(vdd *vdd,isoent *rootent,int depth)

{
  isoent *local_28;
  isoent *np;
  isoent *piStack_18;
  int depth_local;
  isoent *rootent_local;
  vdd *vdd_local;
  
  piStack_18 = rootent;
  if (rootent == (isoent *)0x0) {
    piStack_18 = vdd->rootent;
  }
  local_28 = piStack_18;
  np._4_4_ = depth;
  do {
    path_table_add_entry(vdd->pathtbl + np._4_4_,local_28);
    if (((local_28->subdirs).first == (isoent *)0x0) || (vdd->max_depth <= np._4_4_ + 1)) {
      for (; local_28 != piStack_18; local_28 = local_28->parent) {
        if (local_28->drnext != (isoent *)0x0) {
          local_28 = local_28->drnext;
          break;
        }
        np._4_4_ = np._4_4_ + -1;
      }
    }
    else {
      local_28 = (local_28->subdirs).first;
      np._4_4_ = np._4_4_ + 1;
    }
    if (local_28 == piStack_18) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
isoent_collect_dirs(struct vdd *vdd, struct isoent *rootent, int depth)
{
	struct isoent *np;

	if (rootent == NULL)
		rootent = vdd->rootent;
	np = rootent;
	do {
		/* Register current directory to pathtable. */
		path_table_add_entry(&(vdd->pathtbl[depth]), np);

		if (np->subdirs.first != NULL && depth + 1 < vdd->max_depth) {
			/* Enter to sub directories. */
			np = np->subdirs.first;
			depth++;
			continue;
		}
		while (np != rootent) {
			if (np->drnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				depth--;
			} else {
				np = np->drnext;
				break;
			}
		}
	} while (np != rootent);

	return (ARCHIVE_OK);
}